

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall kratos::IRVisitor::visit_generator_root_p(IRVisitor *this,Generator *generator)

{
  pointer *pptVar1;
  bool bVar2;
  pointer ptVar3;
  pointer ppVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  ulong uVar8;
  priority_task *ppVar9;
  pointer ppVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  runtime_error *this_00;
  ulong uVar12;
  future<void> *t_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  ulong uVar14;
  undefined1 local_200 [8];
  GeneratorGraph graph;
  thread_pool pool;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  undefined1 local_a8 [8];
  future<void> t;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  value_type current_level;
  _Any_data local_60;
  undefined1 local_50 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_200,generator);
  GeneratorGraph::get_leveled_nodes
            ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             (GeneratorGraph *)local_200);
  uVar5 = get_num_cpus();
  cxxpool::thread_pool::thread_pool((thread_pool *)&graph.root_,(ulong)uVar5);
  uVar6 = (int)((ulong)((long)levels.
                              super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                       pool.thread_mutex_.super___mutex_base._M_mutex._32_8_) >> 3) * -0x55555555 -
          1;
  if (-1 < (int)uVar6) {
    uVar12 = (ulong)uVar6;
    do {
      this->level = (uint32_t)uVar12;
      cxxpool::thread_pool::clear((thread_pool *)&graph.root_);
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 (uVar12 * 0x18 +
                 (long)pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next));
      t.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (long)current_level.
                       super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)tasks.
                       super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      this_01 = t.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (p_Var11 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     tasks.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          t.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = this_01._M_pi,
          tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var13,
          p_Var11 !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          current_level.
          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
          super__Vector_impl_data._M_start; p_Var11 = p_Var11 + 1) {
        local_60._8_8_ =
             (((__basic_future<void> *)&p_Var11->_M_pi)->_M_state).
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_60._M_unused._M_object = this;
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        local_40->_M_use_count = 1;
        local_40->_M_weak_count = 1;
        local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002a7730;
        p_Var13 = local_40 + 1;
        std::
        __create_task_state<void(),std::_Bind<kratos::IRVisitor::visit_generator_root_p(kratos::Generator*)::__0(kratos::Generator*)>,std::allocator<int>>
                  ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_ir_cc:114:32)_(kratos::Generator_*)>
                    *)p_Var13,(allocator<int> *)local_60._M_pod_data);
        std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_a8);
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)&pool.field_0x80);
        if (iVar7 != 0) {
          std::__throw_system_error(iVar7);
        }
        if ((char)graph.root_ == '\x01') {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60._M_unused._M_object = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"push called while pool is shutting down","");
          std::runtime_error::runtime_error(this_00,(string *)local_60._M_pod_data);
          *(undefined ***)this_00 = &PTR__runtime_error_002a61a8;
          __cxa_throw(this_00,&cxxpool::thread_pool_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        local_60._8_8_ = local_40;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_use_count = local_40->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_use_count = local_40->_M_use_count + 1;
        }
        local_60._M_unused._M_object = p_Var13;
        __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::
                   operator++((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                              &pool.tasks_.field_0x18);
        ppVar4 = pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ptVar3 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (pool.tasks_.c.
            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            pool.tasks_.c.
            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((long)pool.tasks_.c.
                    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == 0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar14 = (long)pool.tasks_.c.
                         super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage >> 6;
          uVar8 = uVar14 + (uVar14 == 0);
          __n = uVar8 + uVar14;
          if (0x1fffffffffffffe < __n) {
            __n = 0x1ffffffffffffff;
          }
          if (CARRY8(uVar8,uVar14)) {
            __n = 0x1ffffffffffffff;
          }
          if (__n == 0) {
            ppVar9 = (priority_task *)0x0;
          }
          else {
            ppVar9 = __gnu_cxx::new_allocator<cxxpool::detail::priority_task>::allocate
                               ((new_allocator<cxxpool::detail::priority_task> *)
                                &pool.threads_.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,__n,(void *)0x0);
          }
          std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
          construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                    ((allocator_type *)(ppVar9 + uVar14),(priority_task *)&local_60,
                     (anon_class_16_1_80eb7a8b_conflict *)0x0,(unsigned_long *)__args_1,in_R8);
          pptVar1 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar10 = std::
                    vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ::_S_do_relocate(ptVar3,ppVar4,ppVar9,pptVar1);
          ppVar10 = std::
                    vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ::_S_do_relocate(ppVar4,ppVar4,ppVar10 + 1,pptVar1);
          if (ptVar3 != (pointer)0x0) {
            operator_delete(ptVar3,(long)pool.tasks_.c.
                                         super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3);
          }
          pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar9 + __n;
          pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)ppVar9;
        }
        else {
          std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
          construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                    ((allocator_type *)
                     pool.tasks_.c.
                     super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                     ._M_impl.super__Vector_impl_data._M_start,(priority_task *)&local_60,
                     (anon_class_16_1_80eb7a8b_conflict *)0x0,(unsigned_long *)__args_1,in_R8);
          ppVar10 = pool.tasks_.c.
                    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar10;
        std::
        push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
                  (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,ppVar10);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
        std::condition_variable::notify_one();
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)
                   &t.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(future<void> *)local_a8);
        if (t.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     t.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        this_01._M_pi =
             t.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      for (; this_01._M_pi != p_Var13; this_01._M_pi = this_01._M_pi + 1) {
        std::future<void>::get((future<void> *)this_01._M_pi);
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(tasks.
                        super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)current_level.
                              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tasks.
                              super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      bVar2 = 0 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar2);
  }
  cxxpool::thread_pool::~thread_pool((thread_pool *)&graph.root_);
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
             *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_200);
  return;
}

Assistant:

void IRVisitor::visit_generator_root_p(kratos::Generator *generator) {
    GeneratorGraph graph(generator);
    auto levels = graph.get_leveled_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
        level = static_cast<uint32_t>(i);
        pool.clear();
        auto current_level = levels[i];
        std::vector<std::future<void>> tasks;
        tasks.reserve(current_level.size());
        for (auto *mod : current_level) {
            auto t = pool.push([=](Generator *g) { g->accept_generator(this); }, mod);
            tasks.emplace_back(std::move(t));
        }
        for (auto &t : tasks) {
            t.get();
        }
    }
}